

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorPool::CrossLinkOnDemandHelper
          (DescriptorPool *this,string_view name,bool expecting_enum)

{
  Symbol SVar1;
  string_view name_00;
  string lookup_name;
  allocator<char> local_48 [32];
  string_view name_local;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&lookup_name,&name_local,local_48);
  if (lookup_name._M_string_length == 0) {
    lookup_name._M_string_length = 0;
  }
  else if (*lookup_name._M_dataplus._M_p == '.') {
    std::__cxx11::string::substr((ulong)local_48,(ulong)&lookup_name);
    std::__cxx11::string::operator=((string *)&lookup_name,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  name_00._M_str = lookup_name._M_dataplus._M_p;
  name_00._M_len = lookup_name._M_string_length;
  SVar1 = Tables::FindByNameHelper
                    ((this->tables_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                     _M_head_impl,this,name_00);
  std::__cxx11::string::~string((string *)&lookup_name);
  return (Symbol)SVar1.ptr_;
}

Assistant:

Symbol DescriptorPool::CrossLinkOnDemandHelper(absl::string_view name,
                                               bool expecting_enum) const {
  (void)expecting_enum;  // Parameter is used by Google-internal code.
  auto lookup_name = std::string(name);
  if (!lookup_name.empty() && lookup_name[0] == '.') {
    lookup_name = lookup_name.substr(1);
  }
  Symbol result = tables_->FindByNameHelper(this, lookup_name);
  return result;
}